

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_0::sshImpl::~sshImpl(sshImpl *this)

{
  sshImpl *this_local;
  
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__sshImpl_00218c70;
  std::__cxx11::string::~string((string *)&this->status);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->disable);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->enable);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->tog);
  PanelBase::~PanelBase(&this->super_PanelBase);
  return;
}

Assistant:

~sshImpl() = default;